

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

bool __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::
executeThread(MicrothreadManager<implementations::brainfck::BFImplementation> *this,
             _threads_iterator thread)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  
  (this->current_thread)._M_node = thread._M_node;
  iVar4 = *(int *)&thread._M_node[2]._M_parent + 1;
  bVar1 = false;
  while( true ) {
    bVar3 = bVar1;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return bVar3;
    }
    bVar1 = shouldRunThread(this,thread);
    if (!bVar1) break;
    cVar2 = (*(code *)(thread._M_node[1]._M_parent)->_M_left)(&thread._M_node[1]._M_parent);
    bVar1 = true;
    if (cVar2 == '\0') {
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool executeThread(_threads_iterator thread) {
				current_thread = thread;
				bool executed = false;
				for (CycleCount cycle = thread->second.cycles; cycle > 0; --cycle) {
					if (shouldRunThread(thread) == false)
						return executed;
					if (!thread->second.execute())
						return executed;
					executed = true;
				}
				return executed;
			}